

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runsvctrl.c
# Opt level: O2

int ctrl(EVP_PKEY_CTX *ctx,int type,int p1,void *p2)

{
  int __fd;
  ssize_t sVar1;
  int *piVar2;
  char *m2;
  char c_local;
  
  c_local = (char)type;
  __fd = open_write("supervise/control");
  if (__fd == -1) {
    piVar2 = __errno_location();
    if (*piVar2 == error_nodevice) {
      warnx((char *)ctx,"runsv not running.");
      return -1;
    }
    m2 = "unable to open supervise/control";
  }
  else {
    sVar1 = write(__fd,&c_local,1);
    if (sVar1 == 1) {
      return 1;
    }
    m2 = "unable to write to supervise/control";
  }
  warn((char *)ctx,m2);
  return -1;
}

Assistant:

int ctrl(char *name, char c) {
  int fd;

  if ((fd =open_write("supervise/control")) == -1) {
    if (errno == error_nodevice)
      warnx(name, "runsv not running.");
    else
      warn(name, "unable to open supervise/control");
    return(-1);
  }
  if (write(fd, &c, 1) != 1) {
    warn(name, "unable to write to supervise/control");
    return(-1);
  }
  return(1);
}